

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::foo(TestInterfaceImpl *this,FooContext context)

{
  uint uVar1;
  Reader value;
  int local_c0;
  uint sequence;
  DebugComparison<int,_unsigned_int> _kjCondition_1;
  FooContext context_local;
  uint local_8c;
  Builder result;
  Reader params;
  Maybe<capnp::MessageSize> local_30;
  
  uVar1 = *(uint *)context.hook[1]._vptr_CallContextHook;
  *(uint *)context.hook[1]._vptr_CallContextHook = uVar1 + 1;
  sequence = uVar1;
  CallContext<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::getParams(&params,&context_local);
  if ((0x5f < params._reader.dataSize) && ((int)*(uint *)((long)params._reader.data + 8) < 0)) {
    result._builder.capTable._0_4_ = ~*(uint *)((long)params._reader.data + 8);
    result._builder.segment = (SegmentBuilder *)&sequence;
    result._builder.data = anon_var_dwarf_3d166;
    result._builder.pointers = (WirePointer *)&DAT_00000005;
    result._builder.dataSize._0_1_ = uVar1 == (uint)result._builder.capTable;
    if ((!(bool)(undefined1)result._builder.dataSize) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[59],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,900,ERROR,
                 "\"failed: expected \" \"sequence == params.getExpectedCallCount()\", _kjCondition"
                 ,(char (*) [59])"failed: expected sequence == params.getExpectedCallCount()",
                 (DebugComparison<unsigned_int_&,_int> *)&result);
    }
  }
  local_30.ptr.isSet = false;
  CallContext<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::getResults(&result,&context_local,&local_30);
  _kjCondition_1.right = 0;
  if (0x1f < params._reader.dataSize) {
    _kjCondition_1.right = *params._reader.data;
  }
  _kjCondition_1.left = 0x7b;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result = _kjCondition_1.right == 0x7b;
  if ((!_kjCondition_1.result) && (kj::_::Debug::minSeverity < 3)) {
    local_8c = 0;
    local_c0 = 0x7b;
    if (0x1f < params._reader.dataSize) {
      local_8c = *params._reader.data;
    }
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x387,ERROR,
               "\"failed: expected \" \"(123) == (params.getI())\", _kjCondition, 123, params.getI()"
               ,(char (*) [42])"failed: expected (123) == (params.getI())",&_kjCondition_1,&local_c0
               ,&local_8c);
  }
  if (params._reader.dataSize < 0x21) {
    _kjCondition_1.left = (uint)_kjCondition_1.left._1_3_ << 8;
  }
  else {
    _kjCondition_1.left =
         CONCAT31(_kjCondition_1.left._1_3_,*(byte *)((long)params._reader.data + 4)) & 0xffffff01;
    if ((*(byte *)((long)params._reader.data + 4) & 1) != 0) goto LAB_002410b7;
  }
  if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[31],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x388,ERROR,"\"failed: expected \" \"params.getJ()\", _kjCondition",
               (char (*) [31])"failed: expected params.getJ()",
               (DebugExpression<bool> *)&_kjCondition_1);
  }
LAB_002410b7:
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestInterface::FooResults::Builder::setX(&result,value);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestInterfaceImpl::foo(FooContext context) {
  uint sequence = callCount++;
  auto params = context.getParams();
  if (params.getExpectedCallCount() >= 0) {
    KJ_EXPECT(sequence == params.getExpectedCallCount());
  }
  auto result = context.getResults();
  EXPECT_EQ(123, params.getI());
  EXPECT_TRUE(params.getJ());
  result.setX("foo");
  return kj::READY_NOW;
}